

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_stable_pack(REF_GRID ref_grid)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_INT *local_28;
  REF_INT *local_20;
  
  uVar1 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar1 == 0) {
    uVar1 = ref_node_stable_compact(ref_grid->node,&local_28,&local_20);
    if (uVar1 == 0) {
      uVar1 = ref_node_pack(ref_grid->node,local_28,local_20);
      if (uVar1 == 0) {
        lVar4 = 0;
        do {
          uVar1 = ref_cell_pack(ref_grid->cell[lVar4],local_28);
          if (uVar1 != 0) {
            pcVar3 = "pack cell";
            uVar2 = 0x93;
            goto LAB_001556ab;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        uVar1 = ref_geom_pack(ref_grid->geom,local_28);
        if (uVar1 == 0) {
          uVar1 = ref_interp_pack(ref_grid->interp,local_20);
          if (uVar1 == 0) {
            if (local_20 != (REF_INT *)0x0) {
              free(local_20);
            }
            if (local_28 == (REF_INT *)0x0) {
              return 0;
            }
            free(local_28);
            return 0;
          }
          pcVar3 = "pack interp";
          uVar2 = 0x97;
        }
        else {
          pcVar3 = "pack geom";
          uVar2 = 0x96;
        }
      }
      else {
        pcVar3 = "pack node";
        uVar2 = 0x91;
      }
    }
    else {
      pcVar3 = "pack node";
      uVar2 = 0x90;
    }
  }
  else {
    pcVar3 = "sync globals";
    uVar2 = 0x8d;
  }
LAB_001556ab:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
         "ref_grid_stable_pack",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_stable_pack(REF_GRID ref_grid) {
  REF_INT group;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync globals");

  RSS(ref_node_stable_compact(ref_grid_node(ref_grid), &o2n, &n2o),
      "pack node");
  RSS(ref_node_pack(ref_grid_node(ref_grid), o2n, n2o), "pack node");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_pack(ref_cell, o2n), "pack cell");
  }

  RSS(ref_geom_pack(ref_grid_geom(ref_grid), o2n), "pack geom");
  RSS(ref_interp_pack(ref_grid_interp(ref_grid), n2o), "pack interp");

  ref_free(n2o);
  ref_free(o2n);

  return REF_SUCCESS;
}